

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_sorting.cpp
# Opt level: O2

void sorting::indexed(vector<Palette,_std::allocator<Palette>_> *palettes,int palSize,
                     png_color *palRGB,png_byte *palAlpha)

{
  pointer pPVar1;
  long lVar2;
  iterator __first;
  iterator __last;
  ulong uVar3;
  unsigned_short *__i;
  unsigned_short *__last_00;
  Palette *pal;
  pointer this;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_src_gfx_pal_sorting_cpp:26:37)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_src_gfx_pal_sorting_cpp:26:37)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_src_gfx_pal_sorting_cpp:26:37)>
  __comp_01;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_src_gfx_pal_sorting_cpp:26:37)>
  __comp_02;
  int palSize_local;
  png_byte *palAlpha_local;
  png_color *palRGB_local;
  anon_class_16_2_17bc626a pngToRgb;
  
  palSize_local = palSize;
  palAlpha_local = palAlpha;
  palRGB_local = palRGB;
  Options::verbosePrint(&options,'\x02',"Sorting palettes using embedded palette...\n");
  pPVar1 = (palettes->super__Vector_base<Palette,_std::allocator<Palette>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pngToRgb.palRGB = &palRGB_local;
  pngToRgb.palAlpha = &palAlpha_local;
  for (this = (palettes->super__Vector_base<Palette,_std::allocator<Palette>_>)._M_impl.
              super__Vector_impl_data._M_start; this != pPVar1; this = this + 1) {
    __first = Palette::begin(this);
    __last = Palette::end(this);
    if (__first != __last) {
      uVar3 = (long)__last - (long)__first >> 1;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_01._M_comp.pngToRgb = &pngToRgb;
      __comp_01._M_comp.palSize = &palSize_local;
      std::
      __introsort_loop<unsigned_short*,long,__gnu_cxx::__ops::_Iter_comp_iter<sorting::indexed(std::vector<Palette,std::allocator<Palette>>&,int,png_color_struct_const*,unsigned_char*)::__0>>
                (__first,__last,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,__comp_01);
      if ((long)__last - (long)__first < 0x21) {
        __comp_00._M_comp.pngToRgb = &pngToRgb;
        __comp_00._M_comp.palSize = &palSize_local;
        std::
        __insertion_sort<unsigned_short*,__gnu_cxx::__ops::_Iter_comp_iter<sorting::indexed(std::vector<Palette,std::allocator<Palette>>&,int,png_color_struct_const*,unsigned_char*)::__0>>
                  (__first,__last,__comp_00);
      }
      else {
        __last_00 = __first + 0x10;
        __comp._M_comp.pngToRgb = &pngToRgb;
        __comp._M_comp.palSize = &palSize_local;
        std::
        __insertion_sort<unsigned_short*,__gnu_cxx::__ops::_Iter_comp_iter<sorting::indexed(std::vector<Palette,std::allocator<Palette>>&,int,png_color_struct_const*,unsigned_char*)::__0>>
                  (__first,__last_00,__comp);
        for (; __last_00 != __last; __last_00 = __last_00 + 1) {
          __comp_02._M_comp.pngToRgb = &pngToRgb;
          __comp_02._M_comp.palSize = &palSize_local;
          std::
          __unguarded_linear_insert<unsigned_short*,__gnu_cxx::__ops::_Val_comp_iter<sorting::indexed(std::vector<Palette,std::allocator<Palette>>&,int,png_color_struct_const*,unsigned_char*)::__0>>
                    (__last_00,__comp_02);
        }
      }
    }
  }
  return;
}

Assistant:

void indexed(std::vector<Palette> &palettes, int palSize, png_color const *palRGB,
             png_byte *palAlpha) {
	options.verbosePrint(Options::VERB_LOG_ACT, "Sorting palettes using embedded palette...\n");

	auto pngToRgb = [&palRGB, &palAlpha](int index) {
		auto const &c = palRGB[index];
		return Rgba(c.red, c.green, c.blue, palAlpha ? palAlpha[index] : 0xFF);
	};

	for (Palette &pal : palettes) {
		std::sort(pal.begin(), pal.end(), [&](uint16_t lhs, uint16_t rhs) {
			// Iterate through the PNG's palette, looking for either of the two
			for (int i = 0; i < palSize; ++i) {
				uint16_t color = pngToRgb(i).cgbColor();
				if (color == Rgba::transparent) {
					continue;
				}
				// Return whether lhs < rhs
				if (color == rhs) {
					return false;
				}
				if (color == lhs) {
					return true;
				}
			}
			unreachable_(); // This should not be possible
		});
	}
}